

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CollateExpression::Copy(CollateExpression *this)

{
  pointer pPVar1;
  CollateExpression *this_00;
  pointer pCVar2;
  pointer *__ptr;
  long in_RSI;
  templated_unique_single_t copy;
  _Head_base<0UL,_duckdb::CollateExpression_*,_false> local_58;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  string local_40;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 0x38));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_50,pPVar1);
  this_00 = (CollateExpression *)operator_new(0x60);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)(in_RSI + 0x40),
             *(long *)(in_RSI + 0x48) + *(long *)(in_RSI + 0x40));
  local_48._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (ParsedExpression *)0x0;
  CollateExpression(this_00,&local_40,
                    (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     *)&local_48);
  local_58._M_head_impl = this_00;
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_48._M_head_impl = (ParsedExpression *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  pCVar2 = unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
           ::operator->((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
                         *)&local_58);
  (pCVar2->super_ParsedExpression).super_BaseExpression.type = *(ExpressionType *)(in_RSI + 8);
  (pCVar2->super_ParsedExpression).super_BaseExpression.expression_class =
       *(ExpressionClass *)(in_RSI + 9);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pCVar2->super_ParsedExpression).super_BaseExpression.alias);
  (pCVar2->super_ParsedExpression).super_BaseExpression.query_location.index =
       *(idx_t *)(in_RSI + 0x30);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CollateExpression::Copy() const {
	auto copy = make_uniq<CollateExpression>(collation, child->Copy());
	copy->CopyProperties(*this);
	return std::move(copy);
}